

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_delete(REF_LIST ref_list,REF_INT item)

{
  int local_24;
  int local_20;
  REF_INT from;
  REF_INT to;
  REF_INT item_local;
  REF_LIST ref_list_local;
  
  local_20 = 0;
  for (local_24 = 0; local_24 < ref_list->n; local_24 = local_24 + 1) {
    if (item != ref_list->value[local_24]) {
      ref_list->value[local_20] = ref_list->value[local_24];
      local_20 = local_20 + 1;
    }
  }
  if (local_20 == ref_list->n) {
    ref_list_local._4_4_ = 5;
  }
  else {
    ref_list->n = local_20;
    ref_list_local._4_4_ = 0;
  }
  return ref_list_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_list_delete(REF_LIST ref_list, REF_INT item) {
  REF_INT to, from;

  to = 0;
  for (from = 0; from < ref_list_n(ref_list); from++) {
    if (item != ref_list->value[from]) {
      ref_list->value[to] = ref_list->value[from];
      to++;
    }
  }

  if (to == ref_list_n(ref_list)) return REF_NOT_FOUND;

  ref_list_n(ref_list) = to;

  return REF_SUCCESS;
}